

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ItaniumDemangle.cpp
# Opt level: O3

void __thiscall anon_unknown.dwarf_4402ef::PrefixExpr::printLeft(PrefixExpr *this,OutputStream *S)

{
  char *__src;
  Node *pNVar1;
  size_t N;
  
  __src = (this->Prefix).First;
  N = (long)(this->Prefix).Last - (long)__src;
  if (N != 0) {
    OutputStream::grow(S,N);
    memmove(S->Buffer + S->CurrentPosition,__src,N);
    S->CurrentPosition = S->CurrentPosition + N;
  }
  OutputStream::grow(S,1);
  S->Buffer[S->CurrentPosition] = '(';
  S->CurrentPosition = S->CurrentPosition + 1;
  pNVar1 = this->Child;
  (*pNVar1->_vptr_Node[4])(pNVar1,S);
  if (pNVar1->RHSComponentCache != No) {
    (*pNVar1->_vptr_Node[5])(pNVar1,S);
  }
  OutputStream::grow(S,1);
  S->Buffer[S->CurrentPosition] = ')';
  S->CurrentPosition = S->CurrentPosition + 1;
  return;
}

Assistant:

void printLeft(OutputStream &S) const override {
    S += Prefix;
    S += "(";
    Child->print(S);
    S += ")";
  }